

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testSharedFrameBuffer.cpp
# Opt level: O3

void __thiscall anon_unknown.dwarf_2dfa33::WriterThread::run(WriterThread *this)

{
  int iVar1;
  int iVar2;
  double dVar3;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)(anonymous_namespace)::scanlineMutex);
  iVar1 = (anonymous_namespace)::remainingScanlines;
  while ((anonymous_namespace)::remainingScanlines = iVar1, iVar2 == 0) {
    if (iVar1 == 0) goto LAB_001a2f41;
    dVar3 = (double)Imath_3_2::erand48((ushort *)&(anonymous_namespace)::rand1);
    Imf_3_2::RgbaOutputFile::writePixels((int)this->_outfile);
    (anonymous_namespace)::remainingScanlines =
         (anonymous_namespace)::remainingScanlines -
         (int)((double)iVar1 * dVar3 + (1.0 - dVar3) * 0.0 + 0.5);
    pthread_mutex_unlock((pthread_mutex_t *)(anonymous_namespace)::scanlineMutex);
    iVar2 = pthread_mutex_lock((pthread_mutex_t *)(anonymous_namespace)::scanlineMutex);
    iVar1 = (anonymous_namespace)::remainingScanlines;
  }
  std::__throw_system_error(iVar2);
LAB_001a2f41:
  pthread_mutex_unlock((pthread_mutex_t *)(anonymous_namespace)::scanlineMutex);
  IlmThread_3_2::Semaphore::post();
  return;
}

Assistant:

void
WriterThread::run ()
{

    while (true)
    {
        std::lock_guard<std::mutex> lock (scanlineMutex);

        if (remainingScanlines)
        {
            int n = int (rand1.nextf (0.0f, remainingScanlines) + 0.5f);
            _outfile->writePixels (n);
            remainingScanlines -= n;
        }
        else
        {
            break;
        }
    }

    //
    // Signal that the thread has finished
    //

    threadSemaphore.post ();
}